

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::AdvancedPipelinePostXFB::Run(AdvancedPipelinePostXFB *this)

{
  CallLogWrapper *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  RenderTarget *pRVar2;
  bool bVar3;
  GLuint GVar4;
  int iVar5;
  bool *compile_error;
  bool *compile_error_00;
  undefined8 *puVar6;
  string *psVar7;
  char *format;
  int h;
  vec4 *expected;
  long lVar8;
  byte bVar9;
  GLint res;
  float in_data [24];
  float data [24];
  int local_10c;
  string local_108;
  string local_e8 [3];
  string local_88 [3];
  
  bVar9 = 0;
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90d6,&local_10c);
  if (local_10c < 1) {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS <= 0","");
    deqp::SubcaseBase::OutputNotSupported((SubcaseBase *)this,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    lVar8 = 0;
  }
  else {
    paVar1 = &local_e8[0].field_2;
    local_e8[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e8,
               "\nlayout(location = 0) in vec4 g_position;\nlayout(location = 1) in vec4 g_color;\nstruct Vertex {\n  vec4 position;\n  vec4 color;\n};\nout StageData {\n  vec4 color;\n} g_vs_out;\nlayout(binding = 0, std430) buffer StageData {\n  Vertex vertex[];\n} g_vs_buffer;\nvoid main() {\n  gl_Position = g_position;\n  g_vs_out.color = g_color;\n  g_vs_buffer.vertex[gl_VertexID].position = g_position;\n  g_vs_buffer.vertex[gl_VertexID].color = g_color;\n}"
               ,"");
    local_88[0]._M_dataplus._M_p = (pointer)&local_88[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,
               "\nin StageData {\n  vec4 color;\n} g_fs_in;\nlayout(location = 0) out vec4 g_color;\nvoid main() {\n  g_color = g_fs_in.color;\n}"
               ,"");
    GVar4 = ComputeShaderBase::CreateProgram(&this->super_ComputeShaderBase,local_e8,local_88);
    this->m_program[0] = GVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88[0]._M_dataplus._M_p != &local_88[0].field_2) {
      operator_delete(local_88[0]._M_dataplus._M_p,local_88[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8[0]._M_dataplus._M_p,local_e8[0].field_2._M_allocated_capacity + 1);
    }
    local_e8[0]._M_dataplus._M_p = "gl_Position";
    local_e8[0]._M_string_length = 0x1a83ce9;
    glu::CallLogWrapper::glTransformFeedbackVaryings
              (this_00,this->m_program[0],2,(GLchar **)local_e8,0x8c8c);
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program[0]);
    bVar3 = ComputeShaderBase::CheckProgram
                      (&this->super_ComputeShaderBase,this->m_program[0],compile_error);
    lVar8 = -1;
    if (bVar3) {
      local_e8[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e8,
                 "\nlayout(local_size_x = 3) in;\nstruct Vertex {\n  vec4 position;\n  vec4 color;\n};\nlayout(binding = 3, std430) buffer Buffer {\n  Vertex g_vertex[3];\n};\nuniform vec4 g_color1 = vec4(0, 0, 1, 0);\nuniform int g_two = 2;\nvoid UpdateVertex2(int i) {\n  g_vertex[i].color -= vec4(-1, 1, 0, 0);\n}\nvoid main() {\n  switch (gl_GlobalInvocationID.x) {\n    case 0: g_vertex[gl_GlobalInvocationID.x].color += vec4(1, 0, 0, 0); break;\n    case 1: g_vertex[1].color += g_color1; break;\n    case 2: UpdateVertex2(g_two); break;\n    default: return;\n  }\n}"
                 ,"");
      GVar4 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,local_e8);
      this->m_program[1] = GVar4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_e8[0]._M_dataplus._M_p,local_e8[0].field_2._M_allocated_capacity + 1);
      }
      glu::CallLogWrapper::glLinkProgram(this_00,this->m_program[1]);
      bVar3 = ComputeShaderBase::CheckProgram
                        (&this->super_ComputeShaderBase,this->m_program[1],compile_error_00);
      if (bVar3) {
        glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_storage_buffer);
        glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer);
        glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x60,(void *)0x0,0x88e6);
        glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_xfb_buffer);
        glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,0,this->m_xfb_buffer);
        glu::CallLogWrapper::glBufferData(this_00,0x8c8e,0x60,(void *)0x0,0x88e2);
        puVar6 = &DAT_01a79c40;
        psVar7 = local_e8;
        for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
          (psVar7->_M_dataplus)._M_p = (pointer)*puVar6;
          puVar6 = puVar6 + (ulong)bVar9 * -2 + 1;
          psVar7 = (string *)((long)psVar7 + ((ulong)bVar9 * -2 + 1) * 8);
        }
        glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_vertex_buffer);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vertex_buffer);
        glu::CallLogWrapper::glBufferData(this_00,0x8892,0x60,local_e8,0x88e4);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
        glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
        glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vertex_buffer);
        glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0x20,(void *)0x0);
        expected = (vec4 *)0x20;
        glu::CallLogWrapper::glVertexAttribPointer(this_00,1,4,0x1406,'\0',0x20,(void *)0x10);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
        glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
        glu::CallLogWrapper::glEnableVertexAttribArray(this_00,1);
        glu::CallLogWrapper::glBindVertexArray(this_00,0);
        glu::CallLogWrapper::glClear(this_00,0x4000);
        glu::CallLogWrapper::glUseProgram(this_00,this->m_program[0]);
        glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
        glu::CallLogWrapper::glBeginTransformFeedback(this_00,4);
        glu::CallLogWrapper::glDrawArrays(this_00,4,0,3);
        glu::CallLogWrapper::glEndTransformFeedback(this_00);
        glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,3,this->m_xfb_buffer);
        glu::CallLogWrapper::glUseProgram(this_00,this->m_program[1]);
        glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
        glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
        glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer);
        glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,0x60,local_88);
        iVar5 = bcmp(local_88,local_e8,0x60);
        if (iVar5 == 0) {
          psVar7 = local_88;
          glu::CallLogWrapper::glGetBufferSubData(this_00,0x8c8e,0,0x60,local_88);
          h = (int)psVar7;
          iVar5 = bcmp(local_88,&DAT_01a79ca0,0x60);
          if (iVar5 == 0) {
            pRVar2 = (this->super_ComputeShaderBase).renderTarget;
            local_88[0]._M_dataplus._M_p = (pointer)0x3f80000000000000;
            local_88[0]._M_string_length = 0x3f80000000000000;
            bVar3 = ComputeShaderBase::ValidateReadBuffer
                              (&this->super_ComputeShaderBase,pRVar2->m_width,pRVar2->m_height,
                               (int)local_88,h,expected);
            return (ulong)bVar3 - 1;
          }
          format = "Data in xfb buffer is incorrect.\n";
        }
        else {
          format = "Data in shader storage buffer is incorrect.\n";
        }
        anon_unknown_0::Output(format);
        lVar8 = -1;
      }
    }
  }
  return lVar8;
}

Assistant:

virtual long Run()
	{
		GLint res;
		glGetIntegerv(GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS, &res);
		if (res <= 0)
		{
			OutputNotSupported("GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS <= 0");
			return NO_ERROR;
		}

		const char* const glsl_vs =
			NL "layout(location = 0) in vec4 g_position;" NL "layout(location = 1) in vec4 g_color;" NL
			   "struct Vertex {" NL "  vec4 position;" NL "  vec4 color;" NL "};" NL "out StageData {" NL
			   "  vec4 color;" NL "} g_vs_out;" NL "layout(binding = 0, std430) buffer StageData {" NL
			   "  Vertex vertex[];" NL "} g_vs_buffer;" NL "void main() {" NL "  gl_Position = g_position;" NL
			   "  g_vs_out.color = g_color;" NL "  g_vs_buffer.vertex[gl_VertexID].position = g_position;" NL
			   "  g_vs_buffer.vertex[gl_VertexID].color = g_color;" NL "}";

		const char* const glsl_fs =
			NL "in StageData {" NL "  vec4 color;" NL "} g_fs_in;" NL "layout(location = 0) out vec4 g_color;" NL
			   "void main() {" NL "  g_color = g_fs_in.color;" NL "}";

		m_program[0] = CreateProgram(glsl_vs, glsl_fs);
		/* setup xfb varyings */
		{
			const char* const var[2] = { "gl_Position", "StageData.color" };
			glTransformFeedbackVaryings(m_program[0], 2, var, GL_INTERLEAVED_ATTRIBS);
		}
		glLinkProgram(m_program[0]);
		if (!CheckProgram(m_program[0]))
			return ERROR;

		const char* const glsl_cs =
			NL "layout(local_size_x = 3) in;" NL "struct Vertex {" NL "  vec4 position;" NL "  vec4 color;" NL "};" NL
			   "layout(binding = 3, std430) buffer Buffer {" NL "  Vertex g_vertex[3];" NL "};" NL
			   "uniform vec4 g_color1 = vec4(0, 0, 1, 0);" NL "uniform int g_two = 2;" NL
			   "void UpdateVertex2(int i) {" NL "  g_vertex[i].color -= vec4(-1, 1, 0, 0);" NL "}" NL "void main() {" NL
			   "  switch (gl_GlobalInvocationID.x) {" NL
			   "    case 0: g_vertex[gl_GlobalInvocationID.x].color += vec4(1, 0, 0, 0); break;" NL
			   "    case 1: g_vertex[1].color += g_color1; break;" NL "    case 2: UpdateVertex2(g_two); break;" NL
			   "    default: return;" NL "  }" NL "}";
		m_program[1] = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program[1]);
		if (!CheckProgram(m_program[1]))
			return ERROR;

		glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 3 * sizeof(vec4) * 2, NULL, GL_STATIC_COPY);

		glGenBuffers(1, &m_xfb_buffer);
		glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_xfb_buffer);
		glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 3 * sizeof(vec4) * 2, NULL, GL_STREAM_COPY);

		const float in_data[3 * 8] = { -1, -1, 0, 1, 0, 1, 0, 1, 3, -1, 0, 1, 0, 1, 0, 1, -1, 3, 0, 1, 0, 1, 0, 1 };
		glGenBuffers(1, &m_vertex_buffer);
		glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
		glBufferData(GL_ARRAY_BUFFER, sizeof(in_data), in_data, GL_STATIC_DRAW);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glGenVertexArrays(1, &m_vertex_array);
		glBindVertexArray(m_vertex_array);
		glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, 2 * sizeof(vec4), 0);
		glVertexAttribPointer(1, 4, GL_FLOAT, GL_FALSE, 2 * sizeof(vec4), reinterpret_cast<void*>(sizeof(vec4)));
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(1);
		glBindVertexArray(0);

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_program[0]);
		glBindVertexArray(m_vertex_array);
		glBeginTransformFeedback(GL_TRIANGLES);
		glDrawArrays(GL_TRIANGLES, 0, 3);
		glEndTransformFeedback();

		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 3, m_xfb_buffer);
		glUseProgram(m_program[1]);
		glDispatchCompute(1, 1, 1);

		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		/* validate storage buffer */
		{
			float data[3 * 8];
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), data);
			if (memcmp(data, in_data, sizeof(data)) != 0)
			{
				Output("Data in shader storage buffer is incorrect.\n");
				return ERROR;
			}
		}
		/* validate xfb buffer */
		{
			const float ref_data[3 * 8] = {
				-1, -1, 0, 1, 1, 1, 0, 1, 3, -1, 0, 1, 0, 1, 1, 1, -1, 3, 0, 1, 1, 0, 0, 1
			};

			float data[3 * 8];
			glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 0, sizeof(data), data);
			if (memcmp(data, ref_data, sizeof(data)) != 0)
			{
				Output("Data in xfb buffer is incorrect.\n");
				return ERROR;
			}
		}
		if (!ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec4(0, 1, 0, 1)))
		{
			return ERROR;
		}
		return NO_ERROR;
	}